

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriangleQuadrature.hpp
# Opt level: O0

RectMatrix<double,_3U,_3U> *
OpenMD::TriangleQuadrature<OpenMD::RectMatrix<double,_3U,_3U>,_double>::Integrate
          (function<OpenMD::RectMatrix<double,_3U,_3U>_(const_OpenMD::Vector<double,_3U>_&)> *f,
          TriangleQuadratureRule *rule,double *area)

{
  RectMatrix<double,_3U,_3U> *in_RDI;
  function<OpenMD::RectMatrix<double,_3U,_3U>_(const_OpenMD::Vector<double,_2U>_&)> fprime;
  double *in_stack_000000f8;
  TriangleQuadratureRule *in_stack_00000100;
  function<OpenMD::RectMatrix<double,_3U,_3U>_(const_OpenMD::Vector<double,_2U>_&)>
  *in_stack_00000108;
  function<OpenMD::RectMatrix<double,_3U,_3U>_(const_OpenMD::Vector<double,_2U>_&)> local_40 [2];
  
  std::function<OpenMD::RectMatrix<double,3u,3u>(OpenMD::Vector<double,2u>const&)>::
  function<OpenMD::TriangleQuadrature<OpenMD::RectMatrix<double,3u,3u>,double>::Integrate(std::function<OpenMD::RectMatrix<double,3u,3u>(OpenMD::Vector<double,3u>const&)>const&,OpenMD::TriangleQuadratureRule_const&,double_const&)::_lambda(OpenMD::Vector<double,2u>const&)_1_,void>
            (local_40,(anon_class_8_1_54a39806 *)in_RDI);
  Integrate(in_stack_00000108,in_stack_00000100,in_stack_000000f8);
  std::function<OpenMD::RectMatrix<double,_3U,_3U>_(const_OpenMD::Vector<double,_2U>_&)>::~function
            ((function<OpenMD::RectMatrix<double,_3U,_3U>_(const_OpenMD::Vector<double,_2U>_&)> *)
             0x1ed128);
  return in_RDI;
}

Assistant:

NumericReturnType TriangleQuadrature<NumericReturnType, T>::Integrate(
      const std::function<NumericReturnType(const Vector<T, 3>&)>& f,
      const TriangleQuadratureRule& rule, const T& area) {
    // Create a function fprime accepting a 2D barycentric representation but
    // using it to call the given 3D function f.
    std::function<NumericReturnType(const Vector<T, 2>&)> fprime =
        [&f](const Vector<T, 2>& barycentric_2D) {
          return f(Vector3<T>(barycentric_2D[0], barycentric_2D[1],
                              T(1.0) - barycentric_2D[0] - barycentric_2D[1]));
        };

    return Integrate(fprime, rule, area);
  }